

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHelpers.cpp
# Opt level: O0

void OIS::EventUtils::enumerateForceFeedback(int deviceID,LinuxForceFeedback **ff)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  *this;
  ForceFeedback *this_00;
  undefined8 uVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  undefined8 *in_RSI;
  int in_EDI;
  SupportedEffectList *list;
  int effect;
  uchar ff_bits [16];
  map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  forceMap;
  map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
  typeMap;
  undefined8 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf2;
  undefined1 in_stack_fffffffffffffdf3;
  mapped_type in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffdf8;
  int line;
  char *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  OIS_ERROR err;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined8 in_stack_fffffffffffffe18;
  key_type *in_stack_fffffffffffffe28;
  map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  *in_stack_fffffffffffffe30;
  uint local_fc;
  uchar local_f8 [24];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_44;
  undefined8 *local_10;
  int local_4;
  
  err = (OIS_ERROR)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::
  map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
  ::map((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
         *)0x150e8b);
  local_44 = 0x52;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Constant;
  local_58 = 0x57;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Ramp;
  local_5c = 0x53;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Spring;
  local_60 = 0x54;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Friction;
  local_64 = 0x58;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Square;
  local_68 = 0x59;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Triangle;
  local_6c = 0x5a;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Sine;
  local_70 = 0x5b;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = SawToothUp;
  local_74 = 0x5c;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = SawToothDown;
  local_78 = 0x55;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Damper;
  local_7c = 0x56;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Inertia;
  local_80 = 0x5d;
  pmVar5 = std::
           map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
           ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                         *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar5 = Custom;
  std::
  map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
  ::map((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
         *)0x151140);
  local_b4 = 0x52;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = ConstantForce;
  local_b8 = 0x57;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = RampForce;
  local_bc = 0x53;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = ConditionalForce;
  local_c0 = 0x54;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = ConditionalForce;
  local_c4 = 0x58;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = PeriodicForce;
  local_c8 = 0x59;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = PeriodicForce;
  local_cc = 0x5a;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = PeriodicForce;
  local_d0 = 0x5b;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = PeriodicForce;
  local_d4 = 0x5c;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = PeriodicForce;
  local_d8 = 0x55;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *pmVar6 = ConditionalForce;
  local_dc = 0x56;
  this = (map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
          *)std::
            map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
            ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  *(undefined4 *)&(this->_M_t)._M_impl = 4;
  local_e0 = 0x5d;
  pmVar6 = std::
           map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
           ::operator[](this,in_stack_fffffffffffffe28);
  *pmVar6 = CustomForce;
  removeForceFeedback((LinuxForceFeedback **)
                      CONCAT44(in_stack_fffffffffffffdf4,
                               CONCAT13(in_stack_fffffffffffffdf3,
                                        CONCAT12(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0
                                                ))));
  this_00 = (ForceFeedback *)operator_new(0x78);
  LinuxForceFeedback::LinuxForceFeedback
            ((LinuxForceFeedback *)
             CONCAT44(in_stack_fffffffffffffdf4,
                      CONCAT13(in_stack_fffffffffffffdf3,
                               CONCAT12(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0))),iVar4
            );
  *local_10 = this_00;
  memset(local_f8,0,0x10);
  iVar4 = ioctl(local_4,0x80104535,local_f8);
  if (iVar4 != -1) {
    for (local_fc = 0x50; (int)local_fc < 0x5e; local_fc = local_fc + 1) {
      if (((local_fc != 0x50) && (local_fc != 0x51)) && (bVar1 = isBitSet(local_f8,local_fc), bVar1)
         ) {
        pmVar8 = std::
                 map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
                 ::operator[](this,(key_type *)pmVar6);
        in_stack_fffffffffffffdf4 = *pmVar8;
        std::
        map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
        ::operator[]((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
                      *)this,(key_type *)pmVar6);
        ForceFeedback::_addEffectTypes
                  (this_00,(EForce)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   (EType)in_stack_fffffffffffffe18);
      }
    }
    uVar2 = isBitSet(local_f8,0x60);
    if ((bool)uVar2) {
      ForceFeedback::_setGainSupport((ForceFeedback *)*local_10,true);
    }
    uVar3 = isBitSet(local_f8,0x61);
    if ((bool)uVar3) {
      ForceFeedback::_setAutoCenterSupport((ForceFeedback *)*local_10,true);
    }
    ForceFeedback::getSupportedEffects((ForceFeedback *)*local_10);
    sVar9 = std::
            multimap<OIS::Effect::EForce,_OIS::Effect::EType,_std::less<OIS::Effect::EForce>,_std::allocator<std::pair<const_OIS::Effect::EForce,_OIS::Effect::EType>_>_>
            ::size((multimap<OIS::Effect::EForce,_OIS::Effect::EType,_std::less<OIS::Effect::EForce>,_std::allocator<std::pair<const_OIS::Effect::EForce,_OIS::Effect::EType>_>_>
                    *)0x151673);
    if (sVar9 == 0) {
      removeForceFeedback((LinuxForceFeedback **)
                          CONCAT44(in_stack_fffffffffffffdf4,
                                   CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffffdf0))));
    }
    std::
    map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
    ::~map((map<int,_OIS::Effect::EForce,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EForce>_>_>
            *)0x151697);
    std::
    map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
    ::~map((map<int,_OIS::Effect::EType,_std::less<int>,_std::allocator<std::pair<const_int,_OIS::Effect::EType>_>_>
            *)0x1516a4);
    return;
  }
  uVar7 = __cxa_allocate_exception(0x20);
  Exception::Exception
            ((Exception *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),err,
             in_stack_fffffffffffffe00,line,
             (char *)CONCAT44(in_stack_fffffffffffffdf4,
                              CONCAT13(in_stack_fffffffffffffdf3,
                                       CONCAT12(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0)
                                      )));
  __cxa_throw(uVar7,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void EventUtils::enumerateForceFeedback(int deviceID, LinuxForceFeedback** ff)
{
	//Linux Event to OIS Event Mappings
	map<int, Effect::EType> typeMap;
	typeMap[FF_CONSTANT] = Effect::Constant;
	typeMap[FF_RAMP]	 = Effect::Ramp;
	typeMap[FF_SPRING]	 = Effect::Spring;
	typeMap[FF_FRICTION] = Effect::Friction;
	typeMap[FF_SQUARE]	 = Effect::Square;
	typeMap[FF_TRIANGLE] = Effect::Triangle;
	typeMap[FF_SINE]	 = Effect::Sine;
	typeMap[FF_SAW_UP]	 = Effect::SawToothUp;
	typeMap[FF_SAW_DOWN] = Effect::SawToothDown;
	typeMap[FF_DAMPER]	 = Effect::Damper;
	typeMap[FF_INERTIA]	 = Effect::Inertia;
	typeMap[FF_CUSTOM]	 = Effect::Custom;

	map<int, Effect::EForce> forceMap;
	forceMap[FF_CONSTANT] = Effect::ConstantForce;
	forceMap[FF_RAMP]	  = Effect::RampForce;
	forceMap[FF_SPRING]	  = Effect::ConditionalForce;
	forceMap[FF_FRICTION] = Effect::ConditionalForce;
	forceMap[FF_SQUARE]	  = Effect::PeriodicForce;
	forceMap[FF_TRIANGLE] = Effect::PeriodicForce;
	forceMap[FF_SINE]	  = Effect::PeriodicForce;
	forceMap[FF_SAW_UP]	  = Effect::PeriodicForce;
	forceMap[FF_SAW_DOWN] = Effect::PeriodicForce;
	forceMap[FF_DAMPER]	  = Effect::ConditionalForce;
	forceMap[FF_INERTIA]  = Effect::ConditionalForce;
	forceMap[FF_CUSTOM]	  = Effect::CustomForce;

	//Remove any previously existing memory and create fresh
	removeForceFeedback(ff);
	*ff = new LinuxForceFeedback(deviceID);

	//Read overall force feedback features
	unsigned char ff_bits[1 + FF_MAX / 8 / sizeof(unsigned char)];
	memset(ff_bits, 0, sizeof(ff_bits));

#ifdef OIS_LINUX_JOY_DEBUG
	cout << "EventUtils::enumerateForceFeedback(" << deviceID
		 << ") : Reading device force feedback features" << endl;
#endif

	if(ioctl(deviceID, EVIOCGBIT(EV_FF, sizeof(ff_bits)), ff_bits) == -1)
		OIS_EXCEPT(E_General, "Could not read device force feedback features");

#ifdef OIS_LINUX_JOY_DEBUG
	cout << "FF bits: " << hex;
	for(int i = 0; i < sizeof(ff_bits); i++)
		cout << (int)ff_bits[i];
	cout << endl
		 << dec;
#endif

	//FF Axes
	//if( isBitSet(ff_bits, ABS_X) ) //X Axis
	//if( isBitSet(ff_bits, ABS_Y) ) //Y Axis
	//if( isBitSet(ff_bits, ABS_WHEEL) ) //Wheel

	//FF Effects
	for(int effect = FF_EFFECT_MIN; effect <= FF_WAVEFORM_MAX; effect++)
	{
		// The RUMBLE force type is ignored, as periodic force one is more powerfull.
		// The PERIODIC force type is processed later, for each associated periodic effect type.
		if(effect == FF_RUMBLE || effect == FF_PERIODIC)
			continue;

		if(isBitSet(ff_bits, effect))
		{
#ifdef OIS_LINUX_JOY_DEBUG
			cout << "  Effect Type: " << Effect::getEffectTypeName(typeMap[effect]) << endl;
#endif

			(*ff)->_addEffectTypes(forceMap[effect], typeMap[effect]);
		}
	}

	//FF device properties
	if(isBitSet(ff_bits, FF_GAIN))
		(*ff)->_setGainSupport(true);

	if(isBitSet(ff_bits, FF_AUTOCENTER))
		(*ff)->_setAutoCenterSupport(true);

	//Check to see if any effects were added, else destroy the pointer
	const ForceFeedback::SupportedEffectList& list = (*ff)->getSupportedEffects();
	if(list.size() == 0)
		removeForceFeedback(ff);
}